

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

iterator __thiscall QList<QPointer<QMdiSubWindow>_>::end(QList<QPointer<QMdiSubWindow>_> *this)

{
  QPointer<QMdiSubWindow> *n;
  QArrayDataPointer<QPointer<QMdiSubWindow>_> *in_RDI;
  long in_FS_OFFSET;
  QArrayDataPointer<QPointer<QMdiSubWindow>_> *in_stack_ffffffffffffffe0;
  iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  detach((QList<QPointer<QMdiSubWindow>_> *)0x623ae9);
  QArrayDataPointer<QPointer<QMdiSubWindow>_>::operator->(in_RDI);
  n = QArrayDataPointer<QPointer<QMdiSubWindow>_>::end(in_stack_ffffffffffffffe0);
  iterator::iterator(&local_10,n);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (iterator)local_10.i;
  }
  __stack_chk_fail();
}

Assistant:

iterator end() { detach(); return iterator(d->end()); }